

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_remove_window(nk_context *ctx,nk_window *win)

{
  nk_window *win_local;
  nk_context *ctx_local;
  
  if ((win == ctx->begin) || (win == ctx->end)) {
    if ((win == ctx->begin) && (ctx->begin = win->next, win->next != (nk_window *)0x0)) {
      win->next->prev = (nk_window *)0x0;
    }
    if ((win == ctx->end) && (ctx->end = win->prev, win->prev != (nk_window *)0x0)) {
      win->prev->next = (nk_window *)0x0;
    }
  }
  else {
    if (win->next != (nk_window *)0x0) {
      win->next->prev = win->prev;
    }
    if (win->prev != (nk_window *)0x0) {
      win->prev->next = win->next;
    }
  }
  if (((win == ctx->active) || (ctx->active == (nk_window *)0x0)) &&
     (ctx->active = ctx->end, ctx->end != (nk_window *)0x0)) {
    ctx->end->flags = ctx->end->flags & 0xffffefff;
  }
  win->next = (nk_window *)0x0;
  win->prev = (nk_window *)0x0;
  ctx->count = ctx->count - 1;
  return;
}

Assistant:

NK_LIB void
nk_remove_window(struct nk_context *ctx, struct nk_window *win)
{
    if (win == ctx->begin || win == ctx->end) {
        if (win == ctx->begin) {
            ctx->begin = win->next;
            if (win->next)
                win->next->prev = 0;
        }
        if (win == ctx->end) {
            ctx->end = win->prev;
            if (win->prev)
                win->prev->next = 0;
        }
    } else {
        if (win->next)
            win->next->prev = win->prev;
        if (win->prev)
            win->prev->next = win->next;
    }
    if (win == ctx->active || !ctx->active) {
        ctx->active = ctx->end;
        if (ctx->end)
            ctx->end->flags &= ~(nk_flags)NK_WINDOW_ROM;
    }
    win->next = 0;
    win->prev = 0;
    ctx->count--;
}